

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialassetid.cpp
# Opt level: O0

void __thiscall
ConfidentialAssetId_Constractor_bytedata_err_Test::TestBody
          (ConfidentialAssetId_Constractor_bytedata_err_Test *this)

{
  bool bVar1;
  AssertHelper local_b0;
  Message local_a8 [2];
  CfdException *anon_var_0;
  string local_90;
  ByteData local_70;
  undefined1 local_58 [8];
  ConfidentialAssetId assetid;
  char *pcStack_18;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ConfidentialAssetId_Constractor_bytedata_err_Test *this_local;
  
  gtest_msg.value = (char *)this;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffe8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_90,"001122",(allocator *)((long)&anon_var_0 + 7));
      cfd::core::ByteData::ByteData(&local_70,&local_90);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_58,&local_70)
      ;
      cfd::core::ByteData::~ByteData(&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_58);
    }
    pcStack_18 = 
    "Expected: ConfidentialAssetId assetid(ByteData(\"001122\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_a8);
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialassetid.cpp"
             ,0x6f,pcStack_18);
  testing::internal::AssertHelper::operator=(&local_b0,local_a8);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  testing::Message::~Message(local_a8);
  return;
}

Assistant:

TEST(ConfidentialAssetId, Constractor_bytedata_err) {
  // error
  EXPECT_THROW(ConfidentialAssetId assetid(ByteData("001122")), CfdException);
}